

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpermissions.cpp
# Opt level: O0

void QPermissions::Private::requestPermission(QPermission *permission,PermissionCallback *callback)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff68;
  function<void_(Qt::PermissionStatus)> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  PermissionStatus __args;
  QMessageLogger *in_stack_ffffffffffffff80;
  QMessageLogger *in_stack_ffffffffffffff88;
  QDebug *in_stack_ffffffffffffff98;
  char local_50 [8];
  QDebug *in_stack_ffffffffffffffb8;
  QPermission *in_stack_ffffffffffffffc8;
  QDebug *in_stack_ffffffffffffffd0;
  QDebug local_28 [2];
  char *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcPermissions();
  anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  while( true ) {
    __args = (PermissionStatus)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_161020b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x91533c);
    in_stack_ffffffffffffff78 = local_50;
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (int)((ulong)in_stack_ffffffffffffff70 >> 0x20),(char *)in_stack_ffffffffffffff68,
               (char *)0x915355);
    in_stack_ffffffffffffff80 = (QMessageLogger *)&stack0xffffffffffffffd0;
    QMessageLogger::debug(in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff88 =
         (QMessageLogger *)
         QDebug::operator<<(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffff70 =
         (function<void_(Qt::PermissionStatus)> *)
         QDebug::operator<<(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffffc8);
    QDebug::QDebug(local_28,(QDebug *)in_stack_ffffffffffffff70);
    ::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    QDebug::~QDebug(in_stack_ffffffffffffffb8);
    local_10 = 0;
  }
  std::function<void_(Qt::PermissionStatus)>::operator()(in_stack_ffffffffffffff70,__args);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void requestPermission(const QPermission &permission, const PermissionCallback &callback)
    {
        qCDebug(lcPermissions) << "No permission backend on this platform."
            << "Optimistically returning Granted for" << permission;
        callback(Qt::PermissionStatus::Granted);
    }